

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O2

int anon_unknown.dwarf_19796::RtMidiOut_channel(lua_State *L)

{
  RtMidiOut *pRVar1;
  ulong uVar2;
  undefined8 *puVar3;
  
  pRVar1 = getRtMidiOut(L,1);
  uVar2 = luaL_checkinteger(L,2);
  if (0xf < uVar2) {
    luaL_argerror(L,2,"MIDI Channel number must be between 0 and 15");
  }
  puVar3 = (undefined8 *)lua_newuserdata(L,0x10);
  *puVar3 = pRVar1;
  *(int *)(puVar3 + 1) = (int)uVar2;
  lua_getfield(L,0xfff0b9d8,"luartmidi.channelout");
  lua_setmetatable(L,0xfffffffe);
  lua_pushlightuserdata(L,&(anonymous_namespace)::REGISTRY_CHANNELOUT);
  lua_rawget(L,0xfff0b9d8);
  lua_pushvalue(L,0xfffffffe);
  lua_pushvalue(L,1);
  lua_rawset(L,0xfffffffffffffffd);
  lua_settop(L,0xfffffffe);
  return 1;
}

Assistant:

int RtMidiOut_channel(lua_State *L) {
	auto &self = getRtMidiOut(L, 1);
	lua_Integer index = luaL_checkinteger(L, 2);
	luaL_argcheck(L, index >= 0 && index <= 15, 2,
		"MIDI Channel number must be between 0 and 15");

	auto channel = reinterpret_cast<ChannelOut *>(
	 lua_newuserdata(L, sizeof(ChannelOut)));
	new (channel) ChannelOut {&self, static_cast<int>(index)};
	luaL_getmetatable(L, MT_CHANNELOUT);
	lua_setmetatable(L, -2);

	lua_pushlightuserdata(L, &REGISTRY_CHANNELOUT);
	lua_rawget(L, LUA_REGISTRYINDEX);
	lua_pushvalue(L, -2);
	lua_pushvalue(L, 1);
	lua_rawset(L, -3);
	lua_pop(L, 1);

	return 1;
}